

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry * NscBuildExpression(CNscPStackEntry *pExpression,CNscPStackEntry *pAssignment)

{
  bool bVar1;
  UINT32 UVar2;
  CNscPStackEntry *in_RSI;
  CNscContext *in_RDI;
  CNscPStackEntry *pOut;
  undefined4 in_stack_ffffffffffffffc8;
  NscType in_stack_ffffffffffffffcc;
  CNscContext *in_stack_ffffffffffffffd0;
  CNscPStackEntry *in_stack_ffffffffffffffd8;
  CNscContext *this;
  CNscContext *local_8;
  
  if (in_RDI == (CNscContext *)0x0) {
    in_RDI = (CNscContext *)
             CNscContext::GetPStackEntry
                       (in_stack_ffffffffffffffd0,
                        (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    CNscPStackEntry::SetType((CNscPStackEntry *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc)
    ;
  }
  bVar1 = CNscContext::IsPhase2(g_pCtx);
  if ((bVar1) || (bVar1 = CNscContext::IsNWScript(g_pCtx), bVar1)) {
    this = in_RDI;
    CNscPStackEntry::GetType(in_RSI);
    CNscPStackEntry::SetType((CNscPStackEntry *)in_RDI,in_stack_ffffffffffffffcc);
    CNscPStackEntry::AppendData((CNscPStackEntry *)this,in_stack_ffffffffffffffd8);
    local_8 = this;
    UVar2 = CNscPStackEntry::GetFlags((CNscPStackEntry *)this);
    CNscPStackEntry::SetFlags((CNscPStackEntry *)this,UVar2 | 0x800000);
    CNscContext::FreePStackEntry
              (in_RDI,(CNscPStackEntry *)
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  else {
    local_8 = in_RDI;
    if (in_RSI != (CNscPStackEntry *)0x0) {
      CNscContext::FreePStackEntry
                (in_stack_ffffffffffffffd0,
                 (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      local_8 = in_RDI;
    }
  }
  return (CNscPStackEntry *)local_8;
}

Assistant:

YYSTYPE NscBuildExpression (YYSTYPE pExpression, YYSTYPE pAssignment)
{

	//
	// NOTE: Currently, we do not support commas in expressions 
	// (i.e. int i = 5, 6)
	//

	CNscPStackEntry *pOut = pExpression;
	
	//
	// If there isn't an expression, then create
	//

	if (pOut == NULL)
	{
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
		pOut ->SetType (NscType_Unknown);
	}

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pAssignment)
			g_pCtx ->FreePStackEntry (pAssignment);
		return pOut;
	}
	
	//
	// Process the assignment
	//

	pOut ->SetType (pAssignment ->GetType ());
	pOut ->AppendData (pAssignment);
	pOut ->SetFlags (pOut ->GetFlags () | NscSymFlag_InExpression);
	g_pCtx ->FreePStackEntry (pAssignment);

	//
	// Return the new expression
	//

	return pOut;
}